

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

void cfd::core::TaprootUtil::ParseTaprootSignData
               (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *witness_stack,
               SchnorrSignature *schnorr_signature,bool *has_parity,uint8_t *tapleaf_bit,
               SchnorrPubkey *internal_pubkey,
               vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *nodes,
               Script *tapscript,
               vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *stack,
               ByteData *annex)

{
  pointer *this;
  bool bVar1;
  uint8_t uVar2;
  const_reference pvVar3;
  CfdException *pCVar4;
  size_t sVar5;
  ulong local_248;
  size_t index_1;
  undefined1 local_228 [8];
  ByteData256 node;
  size_t index;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f0;
  undefined1 local_1d8 [8];
  ByteData256 pubkey_bytes;
  undefined1 local_1b8 [7];
  uint8_t top;
  Deserializer parser;
  string local_188;
  CfdSourceLocation local_168;
  pointer local_150;
  size_t max_node;
  string local_140;
  CfdSourceLocation local_120;
  undefined1 local_108 [8];
  ByteData data;
  Script script;
  allocator local_79;
  string local_78;
  CfdSourceLocation local_58;
  size_type local_40;
  size_t size;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *nodes_local;
  SchnorrPubkey *internal_pubkey_local;
  uint8_t *tapleaf_bit_local;
  bool *has_parity_local;
  SchnorrSignature *schnorr_signature_local;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *witness_stack_local;
  
  size = (size_t)nodes;
  nodes_local = (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                internal_pubkey;
  internal_pubkey_local = (SchnorrPubkey *)tapleaf_bit;
  tapleaf_bit_local = has_parity;
  has_parity_local = (bool *)schnorr_signature;
  schnorr_signature_local = (SchnorrSignature *)witness_stack;
  local_40 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                       (witness_stack);
  if (1 < local_40) {
    pvVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::back
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        schnorr_signature_local);
    bVar1 = ByteData::IsEmpty(pvVar3);
    if (!bVar1) {
      pvVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::back
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          schnorr_signature_local);
      uVar2 = ByteData::GetHeadData(pvVar3);
      if (uVar2 == 'P') {
        if (annex != (ByteData *)0x0) {
          pvVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::back
                             ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                              schnorr_signature_local);
          ByteData::operator=(annex,pvVar3);
        }
        local_40 = local_40 - 1;
      }
    }
  }
  if (local_40 != 0) {
    if (local_40 == 1) {
      if (has_parity_local != (bool *)0x0) {
        pvVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::at
                           ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                            schnorr_signature_local,0);
        this = &script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        SchnorrSignature::SchnorrSignature((SchnorrSignature *)this,pvVar3);
        SchnorrSignature::operator=((SchnorrSignature *)has_parity_local,(SchnorrSignature *)this);
        SchnorrSignature::~SchnorrSignature
                  ((SchnorrSignature *)
                   &script.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    else {
      pvVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::at
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          schnorr_signature_local,local_40 - 2);
      Script::Script((Script *)
                     &data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar3);
      pvVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::at
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          schnorr_signature_local,local_40 - 1);
      ByteData::ByteData((ByteData *)local_108,pvVar3);
      sVar5 = ByteData::GetDataSize((ByteData *)local_108);
      if ((sVar5 < 0x21) ||
         (sVar5 = ByteData::GetDataSize((ByteData *)local_108), (sVar5 - 1 & 0x1f) != 0)) {
        local_120.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_taproot.cpp"
                     ,0x2f);
        local_120.filename = local_120.filename + 1;
        local_120.line = 0x28c;
        local_120.funcname = "ParseTaprootSignData";
        logger::warn<>(&local_120,"wrong taproot control size.");
        max_node._6_1_ = 1;
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_140,"wrong taproot control size.",
                   (allocator *)((long)&max_node + 7));
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_140);
        max_node._6_1_ = 0;
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      sVar5 = ByteData::GetDataSize((ByteData *)local_108);
      local_150 = (pointer)(sVar5 - 0x21 >> 5);
      if ((pointer)0x80 < local_150) {
        local_168.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_taproot.cpp"
                     ,0x2f);
        local_168.filename = local_168.filename + 1;
        local_168.line = 0x294;
        local_168.funcname = "ParseTaprootSignData";
        logger::warn<unsigned_long&>
                  (&local_168,"taproot control node maximum over. [{}]",(unsigned_long *)&local_150)
        ;
        parser._38_1_ = 1;
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_188,"taproot control node maximum over.",
                   (allocator *)&parser.field_0x27);
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_188);
        parser._38_1_ = 0;
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      Deserializer::Deserializer((Deserializer *)local_1b8,(ByteData *)local_108);
      pubkey_bytes.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ =
           Deserializer::ReadUint8((Deserializer *)local_1b8);
      if (tapleaf_bit_local != (uint8_t *)0x0) {
        *tapleaf_bit_local =
             (pubkey_bytes.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0;
      }
      if (internal_pubkey_local != (SchnorrPubkey *)0x0) {
        *(byte *)&(internal_pubkey_local->data_).data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start =
             pubkey_bytes.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 0xfe;
      }
      Deserializer::ReadBuffer(&local_1f0,(Deserializer *)local_1b8,0x20);
      ByteData256::ByteData256((ByteData256 *)local_1d8,&local_1f0);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f0);
      if (nodes_local !=
          (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)0x0) {
        SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&index,(ByteData256 *)local_1d8);
        SchnorrPubkey::operator=((SchnorrPubkey *)nodes_local,(SchnorrPubkey *)&index);
        SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&index);
      }
      if (size != 0) {
        for (node.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            node.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage < local_150;
            node.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 node.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
          Deserializer::ReadBuffer
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&index_1,
                     (Deserializer *)local_1b8,0x20);
          ByteData256::ByteData256
                    ((ByteData256 *)local_228,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&index_1);
          ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&index_1);
          ::std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
          emplace_back<cfd::core::ByteData256&>
                    ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)size,
                     (ByteData256 *)local_228);
          ByteData256::~ByteData256((ByteData256 *)local_228);
        }
      }
      if (tapscript != (Script *)0x0) {
        Script::operator=(tapscript,
                          (Script *)
                          &data.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      }
      if ((stack != (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)0x0) &&
         (2 < local_40)) {
        for (local_248 = 0; local_248 < local_40 - 2; local_248 = local_248 + 1) {
          pvVar3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::at
                             ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                              schnorr_signature_local,local_248);
          ::std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
          emplace_back<cfd::core::ByteData_const&>
                    ((vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)stack,pvVar3
                    );
        }
      }
      ByteData256::~ByteData256((ByteData256 *)local_1d8);
      Deserializer::~Deserializer((Deserializer *)local_1b8);
      ByteData::~ByteData((ByteData *)local_108);
      Script::~Script((Script *)
                      &data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    return;
  }
  local_58.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_taproot.cpp"
               ,0x2f);
  local_58.filename = local_58.filename + 1;
  local_58.line = 0x280;
  local_58.funcname = "ParseTaprootSignData";
  logger::warn<>(&local_58,"witness_stack is empty.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_78,"witness_stack is empty.",&local_79);
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_78);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void TaprootUtil::ParseTaprootSignData(
    const std::vector<ByteData>& witness_stack,
    SchnorrSignature* schnorr_signature, bool* has_parity,
    uint8_t* tapleaf_bit, SchnorrPubkey* internal_pubkey,
    std::vector<ByteData256>* nodes, Script* tapscript,
    std::vector<ByteData>* stack, ByteData* annex) {
  static constexpr size_t kControlMinimumSize =
      SchnorrPubkey::kSchnorrPubkeySize + 1;

  size_t size = witness_stack.size();
  if ((size >= 2) && (!witness_stack.back().IsEmpty()) &&
      (witness_stack.back().GetHeadData() == TaprootUtil::kAnnexTag)) {
    if (annex != nullptr) *annex = witness_stack.back();
    --size;
  }

  if (size == 0) {
    warn(CFD_LOG_SOURCE, "witness_stack is empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "witness_stack is empty.");
  } else if (size == 1) {
    if (schnorr_signature != nullptr) {
      *schnorr_signature = SchnorrSignature(witness_stack.at(0));
    }
  } else {
    Script script(witness_stack.at(size - 2));
    ByteData data = witness_stack.at(size - 1);
    if ((data.GetDataSize() < kControlMinimumSize) ||
        (((data.GetDataSize() - 1) % kByteData256Length) != 0)) {
      warn(CFD_LOG_SOURCE, "wrong taproot control size.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "wrong taproot control size.");
    }
    size_t max_node =
        (data.GetDataSize() - kControlMinimumSize) / kByteData256Length;
    if (max_node > TaprootScriptTree::kTaprootControlMaxNodeCount) {
      warn(
          CFD_LOG_SOURCE, "taproot control node maximum over. [{}]", max_node);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "taproot control node maximum over.");
    }

    Deserializer parser(data);
    uint8_t top = parser.ReadUint8();
    if (has_parity != nullptr) *has_parity = (top & 0x01);
    if (tapleaf_bit != nullptr) *tapleaf_bit = top & 0xfe;

    ByteData256 pubkey_bytes(parser.ReadBuffer(kByteData256Length));
    if (internal_pubkey != nullptr) {
      *internal_pubkey = SchnorrPubkey(pubkey_bytes);
    }
    if (nodes != nullptr) {
      for (size_t index = 0; index < max_node; ++index) {
        ByteData256 node(parser.ReadBuffer(kByteData256Length));
        nodes->emplace_back(node);
      }
    }

    if (tapscript != nullptr) *tapscript = script;
    if ((stack != nullptr) && (size > 2)) {
      for (size_t index = 0; index < size - 2; ++index) {
        stack->emplace_back(witness_stack.at(index));
      }
    }
  }
}